

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TQualifier::hasNonXfbLayout(TQualifier *this)

{
  bool bVar1;
  undefined1 local_11;
  TQualifier *this_local;
  
  bVar1 = hasUniformLayout(this);
  local_11 = true;
  if (!bVar1) {
    bVar1 = hasAnyLocation(this);
    local_11 = true;
    if (!bVar1) {
      bVar1 = hasStream(this);
      local_11 = true;
      if (!bVar1) {
        bVar1 = hasFormat(this);
        local_11 = true;
        if (!bVar1) {
          bVar1 = isShaderRecord(this);
          local_11 = true;
          if (!bVar1) {
            bVar1 = isPushConstant(this);
            local_11 = true;
            if (!bVar1) {
              local_11 = hasBufferReference(this);
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool hasNonXfbLayout() const
    {
        return hasUniformLayout() ||
               hasAnyLocation() ||
               hasStream() ||
               hasFormat() ||
               isShaderRecord() ||
               isPushConstant() ||
               hasBufferReference();
    }